

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse_data.hpp
# Opt level: O3

pair<std::tuple<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool>
* __thiscall
Disa::insert<double,unsigned_long,int>
          (pair<std::tuple<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool>
           *__return_storage_ptr__,Disa *this,CSR_Data<double,_unsigned_long> *data,int *row,
          int *column,double *value)

{
  int iVar1;
  unsigned_long *puVar2;
  const_iterator __position;
  int iVar3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var4;
  ostream *poVar5;
  long lVar6;
  unsigned_long *puVar7;
  bool bVar8;
  int *piVar9;
  undefined8 uVar10;
  undefined **local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  value_type_conflict1 *local_38;
  
  iVar1 = *(int *)&(data->row_offset).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
  if ((long)iVar1 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_60 = &PTR_s__workspace_llm4binary_github_lic_00160a98;
    console_format_abi_cxx11_(&local_58,(Disa *)0x0,(Log_Level)&local_60,(source_location *)row);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,
                        (char *)CONCAT44(local_58._M_dataplus._M_p._4_4_,
                                         (int)local_58._M_dataplus._M_p),local_58._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Row index must be positive.",0x1b);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    iVar3 = *row;
    if (-1 < iVar3) {
      lVar6 = *(long *)this;
      piVar9 = column;
      if ((*(long *)(this + 8) - lVar6 == 0) ||
         ((*(long *)(this + 8) - lVar6 >> 3) - 1U <= (ulong)(long)iVar1)) {
        local_58._M_dataplus._M_p._0_4_ = iVar1 + 1;
        local_60 = (undefined **)CONCAT44(local_60._4_4_,*(undefined4 *)(this + 0x48));
        resize<double,unsigned_long,int>
                  ((CSR_Data<double,_unsigned_long> *)this,(int *)&local_58,(int *)&local_60);
        iVar3 = *row;
        lVar6 = *(long *)this;
      }
      local_38 = (value_type_conflict1 *)column;
      if (*(ulong *)(this + 0x48) <= (ulong)(long)iVar3) {
        local_58._M_dataplus._M_p._0_4_ = 0;
        if (*(long *)(this + 8) != lVar6) {
          local_58._M_dataplus._M_p._0_4_ = (int)((ulong)(*(long *)(this + 8) - lVar6) >> 3) + -1;
        }
        local_60 = (undefined **)CONCAT44(local_60._4_4_,iVar3 + 1);
        resize<double,unsigned_long,int>
                  ((CSR_Data<double,_unsigned_long> *)this,(int *)&local_58,(int *)&local_60);
        lVar6 = *(long *)this;
      }
      uVar10 = lVar6 + (long)*(int *)&(data->row_offset).
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start * 8;
      lower_bound<double,unsigned_long,int>((type *)&local_58,this,data,row,piVar9);
      if ((local_58.field_2._M_allocated_capacity == uVar10) &&
         (*(unsigned_long *)local_58._M_string_length == (long)*row)) {
        _Var4._M_current =
             (double *)CONCAT44(local_58._M_dataplus._M_p._4_4_,(int)local_58._M_dataplus._M_p);
        bVar8 = false;
        uVar10 = local_58.field_2._M_allocated_capacity;
      }
      else {
        puVar2 = *(unsigned_long **)(this + 8);
        puVar7 = (unsigned_long *)uVar10;
        while (puVar7 = puVar7 + 1, puVar7 < puVar2) {
          *puVar7 = *puVar7 + 1;
        }
        local_60 = (undefined **)(long)*row;
        local_58._M_string_length =
             (size_type)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_insert_rval
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x18),
                        (const_iterator)local_58._M_string_length,(value_type_conflict *)&local_60);
        __position._M_current._4_4_ = local_58._M_dataplus._M_p._4_4_;
        __position._M_current._0_4_ = (int)local_58._M_dataplus._M_p;
        _Var4._M_current =
             (double *)
             std::vector<double,_std::allocator<double>_>::insert
                       ((vector<double,_std::allocator<double>_> *)(this + 0x30),__position,local_38
                       );
        bVar8 = true;
      }
      (__return_storage_ptr__->first).
      super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Tuple_impl<2UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Head_base<2UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
      ._M_head_impl._M_current = _Var4._M_current;
      (__return_storage_ptr__->first).
      super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Head_base<1UL,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
      ._M_head_impl._M_current = (unsigned_long *)local_58._M_string_length;
      (__return_storage_ptr__->first).
      super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Head_base<0UL,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
      ._M_head_impl._M_current = (unsigned_long *)uVar10;
      __return_storage_ptr__->second = bVar8;
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_60 = &PTR_s__workspace_llm4binary_github_lic_00160ab0;
    console_format_abi_cxx11_(&local_58,(Disa *)0x0,(Log_Level)&local_60,(source_location *)row);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,
                        (char *)CONCAT44(local_58._M_dataplus._M_p._4_4_,
                                         (int)local_58._M_dataplus._M_p),local_58._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Columns index must be positive.",0x1f);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  std::__cxx11::string::~string((string *)&local_58);
  exit(1);
}

Assistant:

std::pair<typename CSR_Data<_value_type, _index_type>::iterator, bool> insert(CSR_Data<_value_type, _index_type>& data,
                                                                              const _arg_index_type& row,
                                                                              const _arg_index_type& column,
                                                                              const _value_type& value) {

  // Check sizes
  ASSERT_DEBUG(row >= 0, "Row index must be positive.");
  ASSERT_DEBUG(column >= 0, "Columns index must be positive.");

  // Resize if we need to.
  if(row >= size_row(data)) resize(data, row + 1, static_cast<_arg_index_type>(size_column(data)));
  if(column >= size_column(data)) resize(data, static_cast<_arg_index_type>(size_row(data)), column + 1);

  // Search for new insert
  const auto iter_row_start = data.row_offset.begin() + row;  // tricky, only create after resizing.
  auto [iter_row, iter_column, iter_value] = lower_bound(data, row, column);

  // Entry exists, return no insert.
  if(iter_row == iter_row_start && *iter_column == column)
    return {std::make_tuple(iter_row, iter_column, iter_value), false};

  // Insert new entry.
  for(auto non_zeros = iter_row_start + 1; non_zeros < data.row_offset.end(); ++(*non_zeros++)) {};  // increment and ++
  iter_column = data.i_column.insert(iter_column, column);
  iter_value = data.value.insert(iter_value, value);
  return {std::make_tuple(iter_row_start, iter_column, iter_value), true};
}